

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void DivisionHelper<int,_unsigned_long_long,_3>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (int *t,uint64_t *u,int *result)

{
  ulong uVar1;
  int iVar2;
  
  uVar1 = *u;
  if (uVar1 != 0) {
    if (*t == 0) {
      iVar2 = 0;
    }
    else if (uVar1 < 0x80000000) {
      iVar2 = *t / (int)uVar1;
    }
    else {
      iVar2 = 0;
    }
    *result = iVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const std::uint64_t& u, T& result ) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");

        if( u == 0 )
        {
            E::SafeIntOnDivZero();
        }

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u <= (std::uint64_t)std::numeric_limits<T>::max() )
        {
            result = div_signed_uint64 < T, U, sizeof(T) < sizeof(std::int64_t) > ::divide(t, u);
        }
        else // Corner case
        if( t == std::numeric_limits<T>::min() && u == (std::uint64_t)std::numeric_limits<T>::min() )
        {
            // Min int divided by it's own magnitude is -1
            result = -1;
        }
        else
        {
            result = 0;
        }
    }